

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_construct.cc
# Opt level: O3

void __thiscall
re2c::GoBitmap::GoBitmap
          (GoBitmap *this,Span *span,uint32_t nSpans,Span *hspan,uint32_t hSpans,BitMap *bm,
          State *bm_state,State *next)

{
  Span *sp;
  ulong uVar1;
  SwitchIf *this_00;
  SwitchIf *this_01;
  State *pSVar2;
  int iVar3;
  uint32_t nsp;
  ulong uVar4;
  
  this->bitmap = bm;
  this->bitmap_state = bm_state;
  this->hgo = (SwitchIf *)0x0;
  this->lgo = (SwitchIf *)0x0;
  sp = (Span *)operator_new((ulong)nSpans << 4);
  uVar4 = 0;
  if (nSpans != 0) {
    uVar1 = 0;
    do {
      pSVar2 = *(State **)((long)&span->to + uVar1);
      if (pSVar2 != bm_state) {
        iVar3 = (int)uVar4;
        if ((iVar3 == 0) || (sp[iVar3 - 1U].to != pSVar2)) {
          sp[uVar4].to = pSVar2;
          sp[uVar4].ub = *(uint32_t *)((long)&span->ub + uVar1);
          uVar4 = (ulong)(iVar3 + 1);
        }
        else {
          sp[iVar3 - 1U].ub = *(uint32_t *)((long)&span->ub + uVar1);
        }
      }
      uVar1 = uVar1 + 0x10;
    } while ((ulong)nSpans << 4 != uVar1);
    nsp = (uint32_t)uVar4;
    if (nsp != 0) {
      sp[nsp - 1].ub = span[nSpans - 1].ub;
      this_00 = (SwitchIf *)operator_new(0x10);
      SwitchIf::SwitchIf(this_00,sp,nsp,next);
      goto LAB_0011e686;
    }
  }
  this_00 = (SwitchIf *)0x0;
LAB_0011e686:
  this->lgo = this_00;
  if (hSpans == 0) {
    this_01 = (SwitchIf *)0x0;
  }
  else {
    this_01 = (SwitchIf *)operator_new(0x10);
    pSVar2 = (State *)0x0;
    if (this_00 == (SwitchIf *)0x0) {
      pSVar2 = next;
    }
    SwitchIf::SwitchIf(this_01,hspan,hSpans,pSVar2);
  }
  this->hgo = this_01;
  operator_delete(sp);
  return;
}

Assistant:

GoBitmap::GoBitmap (const Span * span, uint32_t nSpans, const Span * hspan, uint32_t hSpans, const BitMap * bm, const State * bm_state, const State * next)
	: bitmap (bm)
	, bitmap_state (bm_state)
	, hgo (NULL)
	, lgo (NULL)
{
	Span * bspan = allocate<Span> (nSpans);
	uint32_t bSpans = unmap (bspan, span, nSpans, bm_state);
	lgo = bSpans == 0
		? NULL
		:  new SwitchIf (bspan, bSpans, next);
	// if there are any low spans, then next state for high spans
	// must be NULL to trigger explicit goto generation in linear 'if'
	hgo = hSpans == 0
		? NULL
		: new SwitchIf (hspan, hSpans, lgo ? NULL : next);
	operator delete (bspan);
}